

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O0

int __thiscall QTabWidgetPrivate::init(QTabWidgetPrivate *this,EVP_PKEY_CTX *ctx)

{
  QLatin1StringView str;
  QTabWidget *this_00;
  QAnyStringView *this_01;
  QAnyStringView *pQVar1;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QTabBar *tabBar;
  QTabWidget *q;
  undefined8 in_stack_fffffffffffffef8;
  int w;
  code *this_02;
  TabPosition pos;
  QFrame *in_stack_ffffffffffffff00;
  QWidget *this_03;
  QWidget *this_04;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff1c;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  QTabBar *this_05;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar5;
  Object *in_stack_ffffffffffffff60;
  QWidget *local_98;
  QStackedWidget *in_stack_ffffffffffffff78;
  QTabBar *tb;
  QTabBar local_28;
  
  w = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_28.super_QWidget.data = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  this_00 = q_func(this);
  this_01 = (QAnyStringView *)operator_new(0x28);
  QStackedWidget::QStackedWidget(in_stack_ffffffffffffff78,local_98);
  this->stack = (QStackedWidget *)this_01;
  this_04 = (QWidget *)this->stack;
  QVar3 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)this_01,(size_t)in_stack_ffffffffffffff00);
  str.m_data._0_4_ = in_stack_ffffffffffffff18;
  str.m_size = (qsizetype)this_04;
  str.m_data._4_4_ = in_stack_ffffffffffffff1c;
  QAnyStringView::QAnyStringView(this_01,str);
  QObject::setObjectName((QAnyStringView *)this_04);
  uVar5 = 0;
  QFrame::setLineWidth(in_stack_ffffffffffffff00,w);
  uVar4 = SUB84(this->stack,0);
  policy.data = (quint32)((ulong)this->stack >> 0x20);
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)this_04,(Policy)((ulong)this_01 >> 0x20),(Policy)this_01,
             (ControlType)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  QWidget::setSizePolicy(this_04,(QSizePolicy)policy.bits);
  tb = (QTabBar *)QVar3.m_data;
  this_02 = removeTab;
  this_03 = (QWidget *)0x0;
  this_05 = &local_28;
  QObjectPrivate::connect<void(QStackedWidget::*)(int),void(QTabWidgetPrivate::*)(int)>
            (in_stack_ffffffffffffff60,QVar3.m_size,
             (Object *)CONCAT44(uVar5,in_stack_ffffffffffffff58),
             (Function)QStackedWidget::widgetRemoved,(ConnectionType)((ulong)this >> 0x20));
  QMetaObject::Connection::~Connection((Connection *)this_05);
  pQVar1 = (QAnyStringView *)operator_new(0x28);
  QTabBar::QTabBar(this_05,(QWidget *)CONCAT44(policy.data,uVar4));
  Qt::Literals::StringLiterals::operator____L1((char *)this_01,(size_t)this_03);
  QVar3.m_data._0_4_ = uVar4;
  QVar3.m_size = (qsizetype)this_04;
  QVar3.m_data._4_4_ = policy.data;
  QAnyStringView::QAnyStringView(this_01,QVar3);
  QObject::setObjectName(pQVar1);
  QTabBar::setDrawBase((QTabBar *)this_04,SUB81((ulong)this_01 >> 0x38,0));
  QTabWidget::setTabBar(this_00,tb);
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)this_04,(Policy)((ulong)this_01 >> 0x20),(Policy)this_01,
             (ControlType)((ulong)this_03 >> 0x20));
  QWidget::setSizePolicy(this_04,(QSizePolicy)policy.bits);
  QWidget::setFocusPolicy(this_03,(FocusPolicy)((ulong)this_02 >> 0x20));
  QWidget::setFocusProxy((QWidget *)CONCAT44(uVar5,in_stack_ffffffffffffff58),(QWidget *)this);
  pQVar2 = QWidget::style((QWidget *)this_02);
  pos = (TabPosition)((ulong)this_02 >> 0x20);
  (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x56,uVar5,this_00);
  QTabWidget::setTabPosition((QTabWidget *)this_03,pos);
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_28.super_QWidget.data) {
    return (int)*(QWidgetData **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTabWidgetPrivate::init()
{
    Q_Q(QTabWidget);

    stack = new QStackedWidget(q);
    stack->setObjectName("qt_tabwidget_stackedwidget"_L1);
    stack->setLineWidth(0);
    // hack so that QMacStyle::layoutSpacing() can detect tab widget pages
    stack->setSizePolicy(QSizePolicy(QSizePolicy::Preferred, QSizePolicy::Preferred, QSizePolicy::TabWidget));

    QObjectPrivate::connect(stack, &QStackedWidget::widgetRemoved, this, &QTabWidgetPrivate::removeTab);
    QTabBar *tabBar = new QTabBar(q);
    tabBar->setObjectName("qt_tabwidget_tabbar"_L1);
    tabBar->setDrawBase(false);
    q->setTabBar(tabBar);

    q->setSizePolicy(QSizePolicy(QSizePolicy::Expanding, QSizePolicy::Expanding,
                                 QSizePolicy::TabWidget));
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled())
        q->setFocusPolicy(Qt::NoFocus);
    else
#endif
    q->setFocusPolicy(Qt::TabFocus);
    q->setFocusProxy(tabs);
    q->setTabPosition(static_cast<QTabWidget::TabPosition> (q->style()->styleHint(
                      QStyle::SH_TabWidget_DefaultTabPosition, nullptr, q )));

}